

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>::
emplace<QtGraphicsAnchorLayout::GraphPath_const&>
          (iterator *__return_storage_ptr__,
          QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath> *this,
          AnchorVertex **key,GraphPath *args)

{
  Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
  *pDVar1;
  long in_FS_OFFSET;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
             **)this;
  if (pDVar1 == (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                 *)0x0) {
    local_40.d = (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                  *)0x0;
    local_40.m_size = *(qsizetype *)(this + 8);
LAB_005d008a:
    pDVar1 = (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
              *)0x0;
LAB_005d00b5:
    pDVar1 = QHashPrivate::
             Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
             ::detached(pDVar1);
    *(Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
      **)this = pDVar1;
LAB_005d00bd:
    emplace_helper<QtGraphicsAnchorLayout::GraphPath_const&>(__return_storage_ptr__,this,key,args);
    QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::
    ~QMultiHash(&local_40);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_40.m_size = *(qsizetype *)(this + 8);
      local_40.d = pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                   **)this;
        if (pDVar1 == (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                       *)0x0) goto LAB_005d008a;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_005d00b5;
      goto LAB_005d00bd;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        emplace_helper<QtGraphicsAnchorLayout::GraphPath_const&>
                  (__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_005d0156;
    }
    local_40.d = (Data *)(args->positives).q_hash.d;
    if ((local_40.d !=
         (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
          *)0x0) && (((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_40.m_size = (qsizetype)(args->negatives).q_hash.d;
    if (((Data *)local_40.m_size != (Data *)0x0) &&
       ((((Data *)local_40.m_size)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      (((Data *)local_40.m_size)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_40.m_size)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::
    emplace_helper<QtGraphicsAnchorLayout::GraphPath>
              (__return_storage_ptr__,
               (QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
                *)this,key,(GraphPath *)&local_40);
    QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash
              ((QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)&local_40.m_size);
    QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash
              ((QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_005d0156:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }